

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::GetParametersTest::PrepareFramebuffer
          (GetParametersTest *this)

{
  int iVar1;
  deUint32 dVar2;
  GLenum GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *this_02;
  undefined4 *puVar5;
  MessageBuilder local_198;
  long local_18;
  Functions *gl;
  GetParametersTest *this_local;
  
  gl = (Functions *)this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar1);
  (**(code **)(local_18 + 0x6d0))(1,&this->m_fbo);
  dVar2 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar2,"glGenFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xe9c);
  (**(code **)(local_18 + 0x78))(0x8d40,this->m_fbo);
  dVar2 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar2,"glBindFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xe9f);
  (**(code **)(local_18 + 0x6e8))(1,&this->m_rbo);
  dVar2 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar2,"glGenRenderbuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xea2);
  (**(code **)(local_18 + 0xa0))(0x8d41,this->m_rbo);
  dVar2 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar2,"glBindRenderbuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xea5);
  (**(code **)(local_18 + 0x1238))(0x8d41,0x8229,1,2);
  dVar2 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar2,"glRenderbufferStorage has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xea8);
  (**(code **)(local_18 + 0x688))(0x8d40,0x8ce0,0x8d41,this->m_rbo);
  dVar2 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar2,"glFramebufferRenderbuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xeab);
  GVar3 = glwCheckFramebufferStatus(0x8d40);
  if (GVar3 != 0x8cd5) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_198,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    this_02 = tcu::MessageBuilder::operator<<
                        (&local_198,(char (*) [41])"Unexpectedly framebuffer was incomplete.");
    tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_198);
    puVar5 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar5 = 0;
    __cxa_throw(puVar5,&int::typeinfo,0);
  }
  return;
}

Assistant:

void GetParametersTest::PrepareFramebuffer()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genFramebuffers(1, &m_fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffers has failed");

	gl.genRenderbuffers(1, &m_rbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenRenderbuffers has failed");

	gl.bindRenderbuffer(GL_RENDERBUFFER, m_rbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffers has failed");

	gl.renderbufferStorage(GL_RENDERBUFFER, GL_R8, 1, 2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");

	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_rbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer has failed");

	/* Check that framebuffer is complete. */
	if (GL_FRAMEBUFFER_COMPLETE != glCheckFramebufferStatus(GL_FRAMEBUFFER))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Unexpectedly framebuffer was incomplete."
											<< tcu::TestLog::EndMessage;

		throw 0;
	}
}